

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmTargetSelectLinker::Choose_abi_cxx11_(string *__return_storage_ptr__,cmTargetSelectLinker *this)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  string *psVar4;
  cmLocalGenerator *this_00;
  cmake *this_01;
  reference pbVar5;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  cmListFileBacktrace local_200;
  string local_1e0;
  cmake *local_1c0;
  cmake *cm;
  _Self local_1b0;
  const_iterator li;
  ostringstream e;
  allocator local_19;
  cmTargetSelectLinker *local_18;
  cmTargetSelectLinker *this_local;
  
  local_18 = this;
  this_local = (cmTargetSelectLinker *)__return_storage_ptr__;
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Preferred);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->Preferred);
    if (1 < sVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&li);
      poVar3 = std::operator<<((ostream *)&li,"Target ");
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,
                               " contains multiple languages with the highest linker preference");
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->Preference);
      std::operator<<(poVar3,"):\n");
      local_1b0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Preferred);
      while( true ) {
        cm = (cmake *)std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(&this->Preferred);
        bVar1 = std::operator!=(&local_1b0,(_Self *)&cm);
        if (!bVar1) break;
        poVar3 = std::operator<<((ostream *)&li,"  ");
        pbVar5 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1b0);
        poVar3 = std::operator<<(poVar3,(string *)pbVar5);
        std::operator<<(poVar3,"\n");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_1b0);
      }
      std::operator<<((ostream *)&li,"Set the LINKER_LANGUAGE property for this target.");
      this_00 = cmGeneratorTarget::GetLocalGenerator(this->Target);
      this_01 = cmLocalGenerator::GetCMakeInstance(this_00);
      local_1c0 = this_01;
      std::__cxx11::ostringstream::str();
      cmGeneratorTarget::GetBacktrace(&local_200,this->Target);
      cmake::IssueMessage(this_01,FATAL_ERROR,&local_1e0,&local_200);
      cmListFileBacktrace::~cmListFileBacktrace(&local_200);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&li);
    }
    local_208._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Preferred);
    pbVar5 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_208);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Choose()
  {
    if (this->Preferred.empty()) {
      return "";
    }
    if (this->Preferred.size() > 1) {
      std::ostringstream e;
      e << "Target " << this->Target->GetName()
        << " contains multiple languages with the highest linker preference"
        << " (" << this->Preference << "):\n";
      for (std::set<std::string>::const_iterator li = this->Preferred.begin();
           li != this->Preferred.end(); ++li) {
        e << "  " << *li << "\n";
      }
      e << "Set the LINKER_LANGUAGE property for this target.";
      cmake* cm = this->Target->GetLocalGenerator()->GetCMakeInstance();
      cm->IssueMessage(cmake::FATAL_ERROR, e.str(),
                       this->Target->GetBacktrace());
    }
    return *this->Preferred.begin();
  }